

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O2

uint __thiscall
llvm::DWARFVerifier::verifyAppleAccelTable
          (DWARFVerifier *this,DWARFSection *AccelSection,DataExtractor *StrData,char *SectionName)

{
  DWARFObject *pDVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  Tag TVar4;
  int iVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  raw_ostream *prVar10;
  char *pcVar11;
  Error *E_00;
  uint uVar12;
  uint32_t BucketIdx;
  ArrayRef<std::pair<unsigned_short,_llvm::dwarf::Form>_> AVar13;
  pair<unsigned_long,_llvm::dwarf::Tag> pVar14;
  StringRef SVar15;
  AppleAcceleratorTable local_1d8;
  format_object<const_char_*,_unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int,_unsigned_long,_unsigned_int,_unsigned_long,_const_char_*>
  local_148;
  char *local_100;
  char *SectionName_local;
  uint64_t BucketsOffset;
  uint64_t HashOffset;
  uint64_t DataOffset;
  uint64_t StringOffset;
  uint64_t Offset;
  DataExtractor *local_c8;
  char *local_c0;
  char *local_b8;
  _func_int **local_b0;
  ulong local_a8;
  ulong local_a0;
  uint64_t StrpOffset;
  undefined1 auStack_90 [8];
  DWARFDataExtractor AccelSectionData;
  uint32_t BucketIdx_1;
  _Head_base<8UL,_const_char_*,_false> local_58;
  uint64_t HashDataOffset;
  Error E;
  uint32_t local_40;
  uint local_3c;
  uint32_t Hash;
  uint32_t StringCount;
  
  pDVar1 = (this->DCtx->DObj)._M_t.
           super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
           .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl;
  local_100 = SectionName;
  iVar5 = (*pDVar1->_vptr_DWARFObject[5])(pDVar1);
  local_1d8.super_DWARFAcceleratorTable.AccelSection.super_DataExtractor.Data.Data =
       (AccelSection->Data).Data;
  local_1d8.super_DWARFAcceleratorTable.AccelSection.super_DataExtractor.Data.Length =
       (AccelSection->Data).Length;
  local_1d8.super_DWARFAcceleratorTable.AccelSection.super_DataExtractor.IsLittleEndian =
       (uint8_t)iVar5;
  AccelSectionData.super_DataExtractor.Data.Length._1_1_ = 0;
  local_1d8.super_DWARFAcceleratorTable.StringSection.IsLittleEndian = StrData->IsLittleEndian;
  local_1d8.super_DWARFAcceleratorTable.StringSection.AddressSize = StrData->AddressSize;
  local_1d8.super_DWARFAcceleratorTable.StringSection._18_6_ = *(undefined6 *)&StrData->field_0x12;
  local_1d8.HdrData.Atoms.super_SmallVectorImpl<std::pair<unsigned_short,_llvm::dwarf::Form>_>.
  super_SmallVectorTemplateBase<std::pair<unsigned_short,_llvm::dwarf::Form>,_false>.
  super_SmallVectorTemplateCommon<std::pair<unsigned_short,_llvm::dwarf::Form>,_void>.
  super_SmallVectorBase.BeginX =
       &local_1d8.HdrData.Atoms.
        super_SmallVectorStorage<std::pair<unsigned_short,_llvm::dwarf::Form>,_3U>;
  local_1d8.super_DWARFAcceleratorTable.StringSection.Data.Data = (StrData->Data).Data;
  local_1d8.super_DWARFAcceleratorTable.StringSection.Data.Length = (StrData->Data).Length;
  local_1d8.super_DWARFAcceleratorTable.AccelSection.super_DataExtractor.AddressSize = '\0';
  local_1d8.super_DWARFAcceleratorTable.AccelSection.super_DataExtractor._18_4_ =
       AccelSectionData.super_DataExtractor.Data.Length._2_4_;
  local_1d8.super_DWARFAcceleratorTable.AccelSection.super_DataExtractor._22_2_ =
       AccelSectionData.super_DataExtractor.Data.Length._6_2_;
  local_1d8.super_DWARFAcceleratorTable._vptr_DWARFAcceleratorTable =
       (_func_int **)&PTR__AppleAcceleratorTable_00e226a8;
  local_1d8.HdrData.Atoms.super_SmallVectorImpl<std::pair<unsigned_short,_llvm::dwarf::Form>_>.
  super_SmallVectorTemplateBase<std::pair<unsigned_short,_llvm::dwarf::Form>,_false>.
  super_SmallVectorTemplateCommon<std::pair<unsigned_short,_llvm::dwarf::Form>,_void>.
  super_SmallVectorBase.Size = 0;
  local_1d8.HdrData.Atoms.super_SmallVectorImpl<std::pair<unsigned_short,_llvm::dwarf::Form>_>.
  super_SmallVectorTemplateBase<std::pair<unsigned_short,_llvm::dwarf::Form>,_false>.
  super_SmallVectorTemplateCommon<std::pair<unsigned_short,_llvm::dwarf::Form>,_void>.
  super_SmallVectorBase.Capacity = 3;
  local_1d8.IsValid = false;
  local_1d8.super_DWARFAcceleratorTable.AccelSection.Obj = pDVar1;
  local_1d8.super_DWARFAcceleratorTable.AccelSection.Section = AccelSection;
  local_c8 = StrData;
  auStack_90 = (undefined1  [8])
               local_1d8.super_DWARFAcceleratorTable.AccelSection.super_DataExtractor.Data.Data;
  AccelSectionData.super_DataExtractor.Data.Data =
       (char *)local_1d8.super_DWARFAcceleratorTable.AccelSection.super_DataExtractor.Data.Length;
  AccelSectionData.super_DataExtractor.Data.Length._0_1_ =
       local_1d8.super_DWARFAcceleratorTable.AccelSection.super_DataExtractor.IsLittleEndian;
  AccelSectionData.super_DataExtractor._16_8_ = pDVar1;
  AccelSectionData.Obj = (DWARFObject *)AccelSection;
  prVar10 = raw_ostream::operator<<(this->OS,"Verifying ");
  prVar10 = raw_ostream::operator<<(prVar10,SectionName);
  raw_ostream::operator<<(prVar10,"...\n");
  uVar6 = AppleAcceleratorTable::getSizeHdr(&local_1d8);
  if ((char *)(ulong)uVar6 < AccelSectionData.super_DataExtractor.Data.Data) {
    AppleAcceleratorTable::extract((AppleAcceleratorTable *)&HashDataOffset);
    auVar2 = (undefined1  [16])_HashDataOffset & (undefined1  [16])0xfffffffffffffffe;
    HashDataOffset =
         (uint64_t)
         ((ulong)(((undefined1  [16])_HashDataOffset & (undefined1  [16])0xfffffffffffffffe) !=
                 (undefined1  [16])0x0) | HashDataOffset & 0xfffffffffffffffe);
    if (auVar2 == (undefined1  [16])0x0) {
      uVar6 = AppleAcceleratorTable::getNumBuckets(&local_1d8);
      uVar7 = AppleAcceleratorTable::getNumHashes(&local_1d8);
      uVar8 = AppleAcceleratorTable::getSizeHdr(&local_1d8);
      uVar9 = AppleAcceleratorTable::getHeaderDataLength(&local_1d8);
      SectionName_local = (char *)(ulong)(uVar9 + uVar8);
      local_c0 = SectionName_local + uVar6 * 4;
      local_b8 = local_c0 + uVar7 * 4;
      uVar12 = 0;
      StrpOffset = (ulong)uVar6;
      for (iVar5 = 0; (int)StrpOffset != iVar5; iVar5 = iVar5 + 1) {
        uVar6 = DataExtractor::getU32
                          ((DataExtractor *)auStack_90,(uint64_t *)&SectionName_local,(Error *)0x0);
        if (uVar6 != 0xffffffff && uVar7 <= uVar6) {
          prVar10 = error(this);
          local_148.super_format_object_base.Fmt = "Bucket[%d] has invalid hash index: %u.\n";
          local_148.super_format_object_base._vptr_format_object_base =
               (_func_int **)&PTR_home_00e231f0;
          local_148.Vals.
          super__Tuple_impl<0UL,_const_char_*,_unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int,_unsigned_long,_unsigned_int,_unsigned_long,_const_char_*>
          .
          super__Tuple_impl<1UL,_unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int,_unsigned_long,_unsigned_int,_unsigned_long,_const_char_*>
          .
          super__Tuple_impl<2UL,_unsigned_int,_unsigned_int,_unsigned_int,_unsigned_long,_unsigned_int,_unsigned_long,_const_char_*>
          .
          super__Tuple_impl<3UL,_unsigned_int,_unsigned_int,_unsigned_long,_unsigned_int,_unsigned_long,_const_char_*>
          .
          super__Tuple_impl<4UL,_unsigned_int,_unsigned_long,_unsigned_int,_unsigned_long,_const_char_*>
          .super__Tuple_impl<5UL,_unsigned_long,_unsigned_int,_unsigned_long,_const_char_*>.
          super__Tuple_impl<6UL,_unsigned_int,_unsigned_long,_const_char_*>.
          super__Tuple_impl<7UL,_unsigned_long,_const_char_*>.super__Tuple_impl<8UL,_const_char_*>.
          super__Head_base<8UL,_const_char_*,_false>._M_head_impl._4_4_ = iVar5;
          local_148.Vals.
          super__Tuple_impl<0UL,_const_char_*,_unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int,_unsigned_long,_unsigned_int,_unsigned_long,_const_char_*>
          .
          super__Tuple_impl<1UL,_unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int,_unsigned_long,_unsigned_int,_unsigned_long,_const_char_*>
          .
          super__Tuple_impl<2UL,_unsigned_int,_unsigned_int,_unsigned_int,_unsigned_long,_unsigned_int,_unsigned_long,_const_char_*>
          .
          super__Tuple_impl<3UL,_unsigned_int,_unsigned_int,_unsigned_long,_unsigned_int,_unsigned_long,_const_char_*>
          .
          super__Tuple_impl<4UL,_unsigned_int,_unsigned_long,_unsigned_int,_unsigned_long,_const_char_*>
          .super__Tuple_impl<5UL,_unsigned_long,_unsigned_int,_unsigned_long,_const_char_*>.
          super__Tuple_impl<6UL,_unsigned_int,_unsigned_long,_const_char_*>.
          super__Tuple_impl<7UL,_unsigned_long,_const_char_*>.super__Tuple_impl<8UL,_const_char_*>.
          super__Head_base<8UL,_const_char_*,_false>._M_head_impl._0_4_ = uVar6;
          raw_ostream::operator<<(prVar10,&local_148.super_format_object_base);
          uVar12 = uVar12 + 1;
        }
      }
      AVar13 = AppleAcceleratorTable::getAtomsDesc(&local_1d8);
      if ((int)AVar13.Length == 0) {
        prVar10 = error(this);
        pcVar11 = "No atoms: failed to read HashData.\n";
      }
      else {
        bVar3 = AppleAcceleratorTable::validateForms(&local_1d8);
        if (bVar3) {
          local_b0 = (_func_int **)&PTR_home_00e22838;
          for (Hash = 0; Hash < uVar7; Hash = Hash + 1) {
            BucketsOffset = (uint64_t)(local_c0 + (Hash << 2));
            HashOffset = (uint64_t)(local_b8 + (Hash << 2));
            local_40 = DataExtractor::getU32
                                 ((DataExtractor *)auStack_90,&BucketsOffset,(Error *)0x0);
            uVar6 = DataExtractor::getU32((DataExtractor *)auStack_90,&HashOffset,(Error *)0x0);
            local_58._M_head_impl = (char *)(ulong)uVar6;
            if (AccelSectionData.super_DataExtractor.Data.Data <= local_58._M_head_impl + 7) {
              prVar10 = error(this);
              local_148.super_format_object_base.Fmt =
                   "Hash[%d] has invalid HashData offset: 0x%08lx.\n";
              local_148.super_format_object_base._vptr_format_object_base = local_b0;
              local_148.Vals.
              super__Tuple_impl<0UL,_const_char_*,_unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int,_unsigned_long,_unsigned_int,_unsigned_long,_const_char_*>
              .
              super__Tuple_impl<1UL,_unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int,_unsigned_long,_unsigned_int,_unsigned_long,_const_char_*>
              .
              super__Tuple_impl<2UL,_unsigned_int,_unsigned_int,_unsigned_int,_unsigned_long,_unsigned_int,_unsigned_long,_const_char_*>
              .
              super__Tuple_impl<3UL,_unsigned_int,_unsigned_int,_unsigned_long,_unsigned_int,_unsigned_long,_const_char_*>
              .
              super__Tuple_impl<4UL,_unsigned_int,_unsigned_long,_unsigned_int,_unsigned_long,_const_char_*>
              .super__Tuple_impl<5UL,_unsigned_long,_unsigned_int,_unsigned_long,_const_char_*>.
              super__Tuple_impl<6UL,_unsigned_int,_unsigned_long,_const_char_*>.
              super__Tuple_impl<7UL,_unsigned_long,_const_char_*>.
              super__Tuple_impl<8UL,_const_char_*>.super__Head_base<8UL,_const_char_*,_false>.
              _M_head_impl = (_Head_base<8UL,_const_char_*,_false>)
                             (_Head_base<8UL,_const_char_*,_false>)local_58._M_head_impl;
              local_148.Vals.
              super__Tuple_impl<0UL,_const_char_*,_unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int,_unsigned_long,_unsigned_int,_unsigned_long,_const_char_*>
              .
              super__Tuple_impl<1UL,_unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int,_unsigned_long,_unsigned_int,_unsigned_long,_const_char_*>
              .
              super__Tuple_impl<2UL,_unsigned_int,_unsigned_int,_unsigned_int,_unsigned_long,_unsigned_int,_unsigned_long,_const_char_*>
              .
              super__Tuple_impl<3UL,_unsigned_int,_unsigned_int,_unsigned_long,_unsigned_int,_unsigned_long,_const_char_*>
              .
              super__Tuple_impl<4UL,_unsigned_int,_unsigned_long,_unsigned_int,_unsigned_long,_const_char_*>
              .super__Tuple_impl<5UL,_unsigned_long,_unsigned_int,_unsigned_long,_const_char_*>.
              super__Tuple_impl<6UL,_unsigned_int,_unsigned_long,_const_char_*>.
              super__Tuple_impl<7UL,_unsigned_long,_const_char_*>.
              super__Head_base<7UL,_unsigned_long,_false>._M_head_impl._0_4_ = Hash;
              raw_ostream::operator<<(prVar10,&local_148.super_format_object_base);
              uVar12 = uVar12 + 1;
            }
            local_3c = 0;
            while( true ) {
              uVar6 = DataExtractor::getU32
                                ((DataExtractor *)auStack_90,(uint64_t *)&local_58,(Error *)0x0);
              local_a0 = (ulong)uVar6;
              if (uVar6 == 0) break;
              uVar6 = DataExtractor::getU32
                                ((DataExtractor *)auStack_90,(uint64_t *)&local_58,(Error *)0x0);
              for (StringCount = 0; StringCount < uVar6; StringCount = StringCount + 1) {
                pVar14 = AppleAcceleratorTable::readAtoms(&local_1d8,(uint64_t *)&local_58);
                StringOffset = pVar14.first;
                _HashDataOffset = DWARFContext::getDIEForOffset(this->DCtx,StringOffset);
                if (HashDataOffset == (DWARFUnit *)0x0 ||
                    HashDataOffset._8_8_ == (DWARFDebugInfoEntry *)0x0) {
                  AccelSectionData.Section._4_4_ = 0xffffffff;
                  if ((int)StrpOffset != 0) {
                    AccelSectionData.Section._4_4_ =
                         (undefined4)((ulong)local_40 % (StrpOffset & 0xffffffff));
                  }
                  DataOffset = local_a0;
                  pcVar11 = DataExtractor::getCStr(local_c8,&DataOffset);
                  if (pcVar11 == (char *)0x0) {
                    pcVar11 = "<NULL>";
                  }
                  Offset = (uint64_t)pcVar11;
                  prVar10 = error(this);
                  format_object<const_char_*,_unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int,_unsigned_long,_unsigned_int,_unsigned_long,_const_char_*>
                  ::format_object(&local_148,
                                  "%s Bucket[%d] Hash[%d] = 0x%08x Str[%u] = 0x%08lx DIE[%d] = 0x%08lx is not a valid DIE offset for \"%s\".\n"
                                  ,&local_100,(uint *)((long)&AccelSectionData.Section + 4),&Hash,
                                  &local_40,&local_3c,&local_a0,&StringCount,&StringOffset,
                                  (char **)&Offset);
                  raw_ostream::operator<<(prVar10,&local_148.super_format_object_base);
LAB_00b4d8d7:
                  uVar12 = uVar12 + 1;
                }
                else if (((undefined1  [16])pVar14 & (undefined1  [16])0xffff) !=
                         (undefined1  [16])0x0) {
                  TVar4 = DWARFDie::getTag((DWARFDie *)&HashDataOffset);
                  if (pVar14.second != TVar4) {
                    prVar10 = error(this);
                    prVar10 = raw_ostream::operator<<(prVar10,"Tag ");
                    SVar15 = dwarf::TagString(pVar14._8_4_ & 0xffff);
                    prVar10 = raw_ostream::operator<<(prVar10,SVar15);
                    prVar10 = raw_ostream::operator<<
                                        (prVar10," in accelerator table does not match Tag ");
                    TVar4 = DWARFDie::getTag((DWARFDie *)&HashDataOffset);
                    SVar15 = dwarf::TagString((uint)TVar4);
                    prVar10 = raw_ostream::operator<<(prVar10,SVar15);
                    prVar10 = raw_ostream::operator<<(prVar10," of DIE[");
                    prVar10 = raw_ostream::operator<<(prVar10,(ulong)StringCount);
                    raw_ostream::operator<<(prVar10,"].\n");
                    goto LAB_00b4d8d7;
                  }
                }
              }
              local_3c = local_3c + 1;
            }
          }
          goto LAB_00b4d922;
        }
        prVar10 = error(this);
        pcVar11 = "Unsupported form: failed to read HashData.\n";
      }
      raw_ostream::operator<<(prVar10,pcVar11);
    }
    else {
      prVar10 = error(this);
      local_a8 = HashDataOffset | 1;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = E.Payload;
      _HashDataOffset = (DWARFDie)(auVar2 << 0x40);
      toString_abi_cxx11_((string *)&local_148,(llvm *)&local_a8,E_00);
      prVar10 = raw_ostream::operator<<(prVar10,(string *)&local_148);
      raw_ostream::operator<<(prVar10,'\n');
      std::__cxx11::string::~string((string *)&local_148);
      if ((long *)(local_a8 & 0xfffffffffffffffe) != (long *)0x0) {
        (**(code **)(*(long *)(local_a8 & 0xfffffffffffffffe) + 8))();
      }
      if (((undefined1  [16])_HashDataOffset & (undefined1  [16])0xfffffffffffffffe) !=
          (undefined1  [16])0x0) {
        (**(code **)(*(long *)(HashDataOffset & 0xfffffffffffffffe) + 8))();
      }
    }
  }
  else {
    prVar10 = error(this);
    raw_ostream::operator<<(prVar10,"Section is too small to fit a section header.\n");
  }
  uVar12 = 1;
LAB_00b4d922:
  AppleAcceleratorTable::~AppleAcceleratorTable(&local_1d8);
  return uVar12;
}

Assistant:

unsigned DWARFVerifier::verifyAppleAccelTable(const DWARFSection *AccelSection,
                                              DataExtractor *StrData,
                                              const char *SectionName) {
  unsigned NumErrors = 0;
  DWARFDataExtractor AccelSectionData(DCtx.getDWARFObj(), *AccelSection,
                                      DCtx.isLittleEndian(), 0);
  AppleAcceleratorTable AccelTable(AccelSectionData, *StrData);

  OS << "Verifying " << SectionName << "...\n";

  // Verify that the fixed part of the header is not too short.
  if (!AccelSectionData.isValidOffset(AccelTable.getSizeHdr())) {
    error() << "Section is too small to fit a section header.\n";
    return 1;
  }

  // Verify that the section is not too short.
  if (Error E = AccelTable.extract()) {
    error() << toString(std::move(E)) << '\n';
    return 1;
  }

  // Verify that all buckets have a valid hash index or are empty.
  uint32_t NumBuckets = AccelTable.getNumBuckets();
  uint32_t NumHashes = AccelTable.getNumHashes();

  uint64_t BucketsOffset =
      AccelTable.getSizeHdr() + AccelTable.getHeaderDataLength();
  uint64_t HashesBase = BucketsOffset + NumBuckets * 4;
  uint64_t OffsetsBase = HashesBase + NumHashes * 4;
  for (uint32_t BucketIdx = 0; BucketIdx < NumBuckets; ++BucketIdx) {
    uint32_t HashIdx = AccelSectionData.getU32(&BucketsOffset);
    if (HashIdx >= NumHashes && HashIdx != UINT32_MAX) {
      error() << format("Bucket[%d] has invalid hash index: %u.\n", BucketIdx,
                        HashIdx);
      ++NumErrors;
    }
  }
  uint32_t NumAtoms = AccelTable.getAtomsDesc().size();
  if (NumAtoms == 0) {
    error() << "No atoms: failed to read HashData.\n";
    return 1;
  }
  if (!AccelTable.validateForms()) {
    error() << "Unsupported form: failed to read HashData.\n";
    return 1;
  }

  for (uint32_t HashIdx = 0; HashIdx < NumHashes; ++HashIdx) {
    uint64_t HashOffset = HashesBase + 4 * HashIdx;
    uint64_t DataOffset = OffsetsBase + 4 * HashIdx;
    uint32_t Hash = AccelSectionData.getU32(&HashOffset);
    uint64_t HashDataOffset = AccelSectionData.getU32(&DataOffset);
    if (!AccelSectionData.isValidOffsetForDataOfSize(HashDataOffset,
                                                     sizeof(uint64_t))) {
      error() << format("Hash[%d] has invalid HashData offset: "
                        "0x%08" PRIx64 ".\n",
                        HashIdx, HashDataOffset);
      ++NumErrors;
    }

    uint64_t StrpOffset;
    uint64_t StringOffset;
    uint32_t StringCount = 0;
    uint64_t Offset;
    unsigned Tag;
    while ((StrpOffset = AccelSectionData.getU32(&HashDataOffset)) != 0) {
      const uint32_t NumHashDataObjects =
          AccelSectionData.getU32(&HashDataOffset);
      for (uint32_t HashDataIdx = 0; HashDataIdx < NumHashDataObjects;
           ++HashDataIdx) {
        std::tie(Offset, Tag) = AccelTable.readAtoms(&HashDataOffset);
        auto Die = DCtx.getDIEForOffset(Offset);
        if (!Die) {
          const uint32_t BucketIdx =
              NumBuckets ? (Hash % NumBuckets) : UINT32_MAX;
          StringOffset = StrpOffset;
          const char *Name = StrData->getCStr(&StringOffset);
          if (!Name)
            Name = "<NULL>";

          error() << format(
              "%s Bucket[%d] Hash[%d] = 0x%08x "
              "Str[%u] = 0x%08" PRIx64 " DIE[%d] = 0x%08" PRIx64 " "
              "is not a valid DIE offset for \"%s\".\n",
              SectionName, BucketIdx, HashIdx, Hash, StringCount, StrpOffset,
              HashDataIdx, Offset, Name);

          ++NumErrors;
          continue;
        }
        if ((Tag != dwarf::DW_TAG_null) && (Die.getTag() != Tag)) {
          error() << "Tag " << dwarf::TagString(Tag)
                  << " in accelerator table does not match Tag "
                  << dwarf::TagString(Die.getTag()) << " of DIE[" << HashDataIdx
                  << "].\n";
          ++NumErrors;
        }
      }
      ++StringCount;
    }
  }
  return NumErrors;
}